

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::Aggregate::ByteSizeLong(Aggregate *this)

{
  long lVar1;
  anon_union_56_1_493b367e_for_Aggregate_5 aVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  
  aVar2 = this->field_0;
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x3f) == (undefined1  [56])0x0) {
    sVar5 = 0;
  }
  else {
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x1) == (undefined1  [56])0x0) {
      sVar5 = 0;
    }
    else {
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.s_.tagged_ptr_.ptr_ & 0xfffffffffffffffc));
      sVar5 = sVar5 + 1;
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
      sVar3 = google::protobuf::internal::WireFormatLite::MessageSize<proto2_unittest::Aggregate>
                        ((this->field_0)._impl_.sub_);
      sVar5 = sVar5 + sVar3 + 1;
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
      sVar3 = google::protobuf::internal::WireFormatLite::MessageSize<google::protobuf::FileOptions>
                        ((this->field_0)._impl_.file_);
      sVar5 = sVar5 + sVar3 + 1;
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x8) != (undefined1  [56])0x0) {
      sVar3 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::AggregateMessageSet>((this->field_0)._impl_.mset_);
      sVar5 = sVar5 + sVar3 + 1;
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x10) != (undefined1  [56])0x0) {
      sVar3 = google::protobuf::internal::WireFormatLite::MessageSize<google::protobuf::Any>
                        ((this->field_0)._impl_.any_);
      sVar5 = sVar5 + sVar3 + 1;
    }
    if (((undefined1  [56])aVar2 & (undefined1  [56])0x20) != (undefined1  [56])0x0) {
      uVar4 = (long)(this->field_0)._impl_.i_ | 1;
      lVar1 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar1 * 9 + 0x89U >> 6);
    }
  }
  sVar5 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t Aggregate::ByteSizeLong() const {
  const Aggregate& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.Aggregate)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // optional string s = 2;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_s());
    }
    // optional .proto2_unittest.Aggregate sub = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.sub_);
    }
    // optional .google.protobuf.FileOptions file = 4;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.file_);
    }
    // optional .proto2_unittest.AggregateMessageSet mset = 5;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.mset_);
    }
    // optional .google.protobuf.Any any = 6;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.any_);
    }
    // optional int32 i = 1;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_i());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}